

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O2

SentencePieceNormalizer * __thiscall
sentencepiece::SentencePieceNormalizer::Normalize
          (SentencePieceNormalizer *this,string_view input,string *normalized)

{
  long *plVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  undefined1 local_198 [8];
  pointer puStack_190;
  pointer local_188;
  
  plVar1 = *(long **)(input._M_len + 8);
  if (plVar1 == (long *)0x0) {
    local_198._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&puStack_190);
    std::operator<<((ostream *)&puStack_190,"src/sentencepiece_trainer.cc");
    std::operator<<((ostream *)&puStack_190,"(");
    std::ostream::operator<<((ostringstream *)&puStack_190,0x157);
    std::operator<<((ostream *)&puStack_190,") [");
    std::operator<<((ostream *)&puStack_190,"normalizer_");
    std::operator<<((ostream *)&puStack_190,"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&puStack_190);
  }
  else {
    local_198 = (undefined1  [8])0x0;
    puStack_190 = (pointer)0x0;
    local_188 = (pointer)0x0;
    (**(code **)(*plVar1 + 0x20))(this,plVar1,input._M_str);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_198);
  }
  return this;
}

Assistant:

util::Status SentencePieceNormalizer::Normalize(absl::string_view input,
                                                std::string *normalized) const {
  CHECK_OR_RETURN(normalizer_);
  std::vector<size_t> norm_to_orig;
  return normalizer_->Normalize(input, normalized, &norm_to_orig);
}